

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::QualifiedClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *d,Options *options)

{
  string_view name;
  FileDescriptor *this_00;
  Descriptor *descriptor;
  Options *in_R9;
  string local_50;
  undefined1 local_30 [16];
  Descriptor *local_20;
  Options *options_local;
  Descriptor *d_local;
  
  local_20 = d;
  options_local = (Options *)this;
  d_local = (Descriptor *)__return_storage_ptr__;
  this_00 = Descriptor::file((Descriptor *)this);
  ClassName_abi_cxx11_(&local_50,(cpp *)options_local,descriptor);
  local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  name._M_str = (char *)local_20;
  name._M_len = local_30._8_8_;
  QualifiedFileLevelSymbol_abi_cxx11_
            (__return_storage_ptr__,(cpp *)this_00,local_30._0_8_,name,in_R9);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string QualifiedClassName(const Descriptor* d, const Options& options) {
  return QualifiedFileLevelSymbol(d->file(), ClassName(d), options);
}